

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O2

void __thiscall Txid_TxidEqualsUnMatch_Test::TestBody(Txid_TxidEqualsUnMatch_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_80;
  Txid txid2;
  AssertionResult gtest_ar_;
  Txid txid1;
  
  std::__cxx11::string::string
            ((string *)&txid2,"1234567890123456789012345678901234567890123456789012345678901234",
             (allocator *)&local_80);
  cfd::core::Txid::Txid(&txid1,(string *)&txid2);
  std::__cxx11::string::~string((string *)&txid2);
  std::__cxx11::string::string
            ((string *)&local_80,"0234567890123456789012345678901234567890123456789012345678901234",
             (allocator *)&gtest_ar_);
  cfd::core::Txid::Txid(&txid2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = cfd::core::Txid::Equals(&txid1,&txid2);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)&gtest_ar_,(AssertionResult *)"txid1.Equals(txid2)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x3d,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::Txid::~Txid(&txid2);
  cfd::core::Txid::~Txid(&txid1);
  return;
}

Assistant:

TEST(Txid, TxidEqualsUnMatch) {
  Txid txid1 = Txid(
      "1234567890123456789012345678901234567890123456789012345678901234");
  Txid txid2 = Txid(
      "0234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_FALSE(txid1.Equals(txid2));
}